

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

void Ver_ParseReportUndefBoxes(Ver_Man_t *pMan)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  
  pVVar7 = pMan->pDesign->vModules;
  iVar1 = pVVar7->nSize;
  lVar6 = (long)iVar1;
  if (lVar6 < 1) {
    uVar8 = 0;
  }
  else {
    ppvVar2 = pVVar7->pArray;
    lVar9 = 0;
    uVar8 = 0;
    do {
      pvVar3 = ppvVar2[lVar9];
      *(undefined4 *)((long)pvVar3 + 0xc4) = 0;
      if (*(long *)((long)pvVar3 + 8) == 0) goto LAB_0034f5b0;
      uVar11 = 0;
      if (*(int *)(*(long *)((long)pvVar3 + 0x28) + 4) == 0) {
        uVar11 = (uint)(*(int *)(*(long *)((long)pvVar3 + 0x30) + 4) == 0);
      }
      uVar8 = (ulong)((int)uVar8 + uVar11);
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  if (0 < iVar1) {
    ppvVar2 = pVVar7->pArray;
    lVar9 = 0;
    do {
      lVar4 = *(long *)((long)ppvVar2[lVar9] + 0x50);
      lVar10 = (long)*(int *)(lVar4 + 4);
      if (0 < lVar10) {
        lVar4 = *(long *)(lVar4 + 8);
        lVar12 = 0;
        do {
          lVar5 = *(long *)(lVar4 + lVar12 * 8);
          if (((*(uint *)(lVar5 + 0x14) & 0xf) == 10) &&
             (lVar5 = *(long *)(lVar5 + 0x38), lVar5 != 0)) {
            if (*(long *)(lVar5 + 8) == 0) goto LAB_0034f5b0;
            if ((*(int *)(*(long *)(lVar5 + 0x28) + 4) == 0) &&
               (*(int *)(*(long *)(lVar5 + 0x30) + 4) == 0)) {
              *(int *)(lVar5 + 0xc4) = *(int *)(lVar5 + 0xc4) + 1;
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar10 != lVar12);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar6);
  }
  printf("Warning: The design contains %d undefined object types interpreted as blackboxes:\n",uVar8
        );
  pVVar7 = pMan->pDesign->vModules;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar6];
      if (*(long *)((long)pvVar3 + 8) == 0) {
LAB_0034f5b0:
        __assert_fail("pNtkBox->pName",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x4d,"int Ver_NtkIsDefined(Abc_Ntk_t *)");
      }
      if ((*(int *)(*(long *)((long)pvVar3 + 0x28) + 4) == 0) &&
         (*(int *)(*(long *)((long)pvVar3 + 0x30) + 4) == 0)) {
        printf("%s (%d)  ",*(long *)((long)pvVar3 + 8),(ulong)*(uint *)((long)pvVar3 + 0xc4));
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pMan->pDesign->vModules;
    } while (lVar6 < pVVar7->nSize);
  }
  putchar(10);
  pVVar7 = pMan->pDesign->vModules;
  lVar6 = (long)pVVar7->nSize;
  if (0 < lVar6) {
    ppvVar2 = pVVar7->pArray;
    lVar9 = 0;
    do {
      *(undefined4 *)((long)ppvVar2[lVar9] + 0xc4) = 0;
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  return;
}

Assistant:

void Ver_ParseReportUndefBoxes( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, nBoxes;
    // clean 
    nBoxes = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        pNtk->fHiePath = 0;
        if ( !Ver_NtkIsDefined(pNtk) )
            nBoxes++;
    }
    // count
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        Abc_NtkForEachBlackbox( pNtk, pBox, k )
            if ( pBox->pData && !Ver_NtkIsDefined((Abc_Ntk_t *)pBox->pData) )
                ((Abc_Ntk_t *)pBox->pData)->fHiePath++;
    // print the stats
    printf( "Warning: The design contains %d undefined object types interpreted as blackboxes:\n", nBoxes );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        if ( !Ver_NtkIsDefined(pNtk) )
            printf( "%s (%d)  ", Abc_NtkName(pNtk), pNtk->fHiePath );
    printf( "\n" );
    // clean 
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->fHiePath = 0;
}